

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::Texture3DSpecCase::Texture3DSpecCase
          (Texture3DSpecCase *this,Context *context,char *name,char *desc,TextureFormat *format,
          int width,int height,int depth,int numLevels)

{
  TextureSpecCase::TextureSpecCase(&this->super_TextureSpecCase,context,name,desc);
  (this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture3DSpecCase_021850d0;
  this->m_texFormat = *format;
  tcu::getTextureFormatInfo(&this->m_texFormatInfo,format);
  this->m_width = width;
  this->m_height = height;
  this->m_depth = depth;
  this->m_numLevels = numLevels;
  return;
}

Assistant:

Texture3DSpecCase::Texture3DSpecCase (Context& context, const char* name, const char* desc, const tcu::TextureFormat& format, int width, int height, int depth, int numLevels)
	: TextureSpecCase		(context, name, desc)
	, m_texFormat			(format)
	, m_texFormatInfo		(tcu::getTextureFormatInfo(format))
	, m_width				(width)
	, m_height				(height)
	, m_depth				(depth)
	, m_numLevels			(numLevels)
{
}